

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O1

int secp256k1_musig_pubkey_get
              (secp256k1_context *ctx,secp256k1_pubkey *agg_pk,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  int iVar1;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_keyagg_cache_internal local_100;
  
  if (agg_pk == (secp256k1_pubkey *)0x0) {
    secp256k1_musig_pubkey_get_cold_2();
  }
  else {
    agg_pk->data[0x30] = '\0';
    agg_pk->data[0x31] = '\0';
    agg_pk->data[0x32] = '\0';
    agg_pk->data[0x33] = '\0';
    agg_pk->data[0x34] = '\0';
    agg_pk->data[0x35] = '\0';
    agg_pk->data[0x36] = '\0';
    agg_pk->data[0x37] = '\0';
    agg_pk->data[0x38] = '\0';
    agg_pk->data[0x39] = '\0';
    agg_pk->data[0x3a] = '\0';
    agg_pk->data[0x3b] = '\0';
    agg_pk->data[0x3c] = '\0';
    agg_pk->data[0x3d] = '\0';
    agg_pk->data[0x3e] = '\0';
    agg_pk->data[0x3f] = '\0';
    agg_pk->data[0x20] = '\0';
    agg_pk->data[0x21] = '\0';
    agg_pk->data[0x22] = '\0';
    agg_pk->data[0x23] = '\0';
    agg_pk->data[0x24] = '\0';
    agg_pk->data[0x25] = '\0';
    agg_pk->data[0x26] = '\0';
    agg_pk->data[0x27] = '\0';
    agg_pk->data[0x28] = '\0';
    agg_pk->data[0x29] = '\0';
    agg_pk->data[0x2a] = '\0';
    agg_pk->data[0x2b] = '\0';
    agg_pk->data[0x2c] = '\0';
    agg_pk->data[0x2d] = '\0';
    agg_pk->data[0x2e] = '\0';
    agg_pk->data[0x2f] = '\0';
    agg_pk->data[0x10] = '\0';
    agg_pk->data[0x11] = '\0';
    agg_pk->data[0x12] = '\0';
    agg_pk->data[0x13] = '\0';
    agg_pk->data[0x14] = '\0';
    agg_pk->data[0x15] = '\0';
    agg_pk->data[0x16] = '\0';
    agg_pk->data[0x17] = '\0';
    agg_pk->data[0x18] = '\0';
    agg_pk->data[0x19] = '\0';
    agg_pk->data[0x1a] = '\0';
    agg_pk->data[0x1b] = '\0';
    agg_pk->data[0x1c] = '\0';
    agg_pk->data[0x1d] = '\0';
    agg_pk->data[0x1e] = '\0';
    agg_pk->data[0x1f] = '\0';
    agg_pk->data[0] = '\0';
    agg_pk->data[1] = '\0';
    agg_pk->data[2] = '\0';
    agg_pk->data[3] = '\0';
    agg_pk->data[4] = '\0';
    agg_pk->data[5] = '\0';
    agg_pk->data[6] = '\0';
    agg_pk->data[7] = '\0';
    agg_pk->data[8] = '\0';
    agg_pk->data[9] = '\0';
    agg_pk->data[10] = '\0';
    agg_pk->data[0xb] = '\0';
    agg_pk->data[0xc] = '\0';
    agg_pk->data[0xd] = '\0';
    agg_pk->data[0xe] = '\0';
    agg_pk->data[0xf] = '\0';
    if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
      secp256k1_musig_pubkey_get_cold_1();
    }
    else {
      iVar1 = secp256k1_keyagg_cache_load(ctx,&local_100,keyagg_cache);
      if (iVar1 != 0) {
        secp256k1_ge_to_bytes(agg_pk->data,&local_100.pk);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_musig_pubkey_get(const secp256k1_context* ctx, secp256k1_pubkey *agg_pk, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(agg_pk != NULL);
    memset(agg_pk, 0, sizeof(*agg_pk));
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_pubkey_save(agg_pk, &cache_i.pk);
    return 1;
}